

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TaggedPatternSyntax::setChild
          (TaggedPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffffa8;
  undefined8 local_50;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffa8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffa8);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x28) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x30) = local_28;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7cf4cc);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_50 = (PatternSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7cf4dc);
      local_50 = SyntaxNode::as<slang::syntax::PatternSyntax>(pSVar1);
    }
    *(PatternSyntax **)(in_RDI + 0x38) = local_50;
  }
  return;
}

Assistant:

void TaggedPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: tagged = child.token(); return;
        case 1: memberName = child.token(); return;
        case 2: pattern = child.node() ? &child.node()->as<PatternSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}